

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolortransform.cpp
# Opt level: O1

void __thiscall
QColorTransformPrivate::applyConvertIn<unsigned_char>
          (QColorTransformPrivate *this,uchar *src,QColorVector *buffer,qsizetype len,
          TransformFlags flags)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  QColorSpacePrivate *pQVar11;
  element_type *peVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  undefined1 auVar25 [16];
  bool bVar26;
  float *pfVar27;
  long lVar28;
  QColorVector *pQVar29;
  _Array_type *__vtable;
  long lVar30;
  variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT> *pvVar31;
  long in_FS_OFFSET;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar35 [16];
  QColorVector QVar36;
  anon_class_16_2_4b7f43a0 local_50;
  QColorVector *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = buffer;
  bVar26 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceIn).d.ptr);
  if (bVar26) {
    pQVar11 = (this->colorSpaceIn).d.ptr;
    if ((pQVar11->colorModel == Gray) ||
       ((peVar12 = (pQVar11->lut).table[0].
                   super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
        peVar12 ==
        (pQVar11->lut).table[1].super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        && (peVar12 ==
            (pQVar11->lut).table[2].super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)))) {
      if (0 < len) {
        pfVar27 = &local_40->z;
        lVar30 = 0;
        do {
          fVar32 = QColorTrcLut::u8ToLinearF32
                             ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                              super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                              (uint)src[lVar30]);
          pQVar11 = (this->colorSpaceIn).d.ptr;
          uVar1 = (pQVar11->whitePoint).x;
          uVar6 = (pQVar11->whitePoint).y;
          uVar2 = (pQVar11->whitePoint).z;
          uVar7 = (pQVar11->whitePoint).w;
          ((QColorVector *)(pfVar27 + -2))->x = (float)uVar1 * fVar32;
          pfVar27[-1] = (float)uVar6 * fVar32;
          *pfVar27 = (float)uVar2 * fVar32;
          pfVar27[1] = (float)uVar7 * fVar32;
          lVar30 = lVar30 + 1;
          pfVar27 = pfVar27 + 4;
        } while (len != lVar30);
      }
    }
    else if (0 < len) {
      pfVar27 = &local_40->z;
      lVar30 = 0;
      do {
        fVar32 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[0].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar30]);
        fVar33 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[1].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar30]);
        fVar34 = QColorTrcLut::u8ToLinearF32
                           ((((this->colorSpaceIn).d.ptr)->lut).table[2].
                            super___shared_ptr<QColorTrcLut,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            (uint)src[lVar30]);
        pQVar11 = (this->colorSpaceIn).d.ptr;
        uVar3 = (pQVar11->toXyz).r.x;
        uVar8 = (pQVar11->toXyz).r.y;
        uVar4 = (pQVar11->toXyz).g.x;
        uVar9 = (pQVar11->toXyz).g.y;
        uVar5 = (pQVar11->toXyz).b.x;
        uVar10 = (pQVar11->toXyz).b.y;
        QVar36.y = fVar34 * (float)uVar10 + fVar32 * (float)uVar8 + (float)uVar9 * fVar33;
        QVar36.x = fVar34 * (float)uVar5 + fVar32 * (float)uVar3 + (float)uVar4 * fVar33;
        QVar36.z = fVar34 * (pQVar11->toXyz).b.z +
                   fVar32 * (pQVar11->toXyz).r.z + fVar33 * (pQVar11->toXyz).g.z;
        QVar36.w = 0.0;
        *(QColorVector *)(pfVar27 + -2) = QVar36;
        lVar30 = lVar30 + 1;
        pfVar27 = pfVar27 + 4;
      } while (len != lVar30);
    }
    bVar26 = QColorSpacePrivate::isThreeComponentMatrix((this->colorSpaceOut).d.ptr);
    if ((((!bVar26) || (((this->colorSpaceIn).d.ptr)->colorModel != Gray)) &&
        (bVar26 = QColorMatrix::isNull(&((this->colorSpaceIn).d.ptr)->chad), auVar25 = _DAT_006a97c0
        , !bVar26)) && (0 < len)) {
      pQVar11 = (this->colorSpaceIn).d.ptr;
      fVar32 = (pQVar11->chad).r.x;
      fVar33 = (pQVar11->chad).r.y;
      fVar34 = (pQVar11->chad).r.z;
      fVar13 = (pQVar11->chad).r.w;
      fVar14 = (pQVar11->chad).g.x;
      fVar15 = (pQVar11->chad).g.y;
      fVar16 = (pQVar11->chad).g.z;
      fVar17 = (pQVar11->chad).g.w;
      fVar18 = (pQVar11->chad).b.x;
      fVar19 = (pQVar11->chad).b.y;
      fVar20 = (pQVar11->chad).b.z;
      fVar21 = (pQVar11->chad).b.w;
      pQVar29 = local_40;
      do {
        fVar22 = pQVar29->x;
        fVar23 = pQVar29->y;
        fVar24 = pQVar29->z;
        auVar35._0_4_ = fVar24 * fVar18 + fVar23 * fVar14 + fVar22 * fVar32;
        auVar35._4_4_ = fVar24 * fVar19 + fVar23 * fVar15 + fVar22 * fVar33;
        auVar35._8_4_ = fVar24 * fVar20 + fVar23 * fVar16 + fVar22 * fVar34;
        auVar35._12_4_ = fVar24 * fVar21 + fVar23 * fVar17 + fVar22 * fVar13;
        auVar35 = minps(auVar35,auVar25);
        QVar36 = (QColorVector)maxps(auVar35,ZEXT816(0));
        *pQVar29 = QVar36;
        pQVar29 = pQVar29 + 1;
        len = len + -1;
      } while (len != 0);
    }
  }
  else {
    if (0 < len) {
      pfVar27 = &local_40->z;
      lVar30 = 0;
      do {
        fVar32 = (float)src[lVar30] * 0.003921569;
        ((QColorVector *)(pfVar27 + -2))->x = fVar32;
        pfVar27[-1] = fVar32;
        *pfVar27 = fVar32;
        lVar30 = lVar30 + 1;
        pfVar27 = pfVar27 + 4;
      } while (len != lVar30);
    }
    pQVar11 = (this->colorSpaceIn).d.ptr;
    lVar30 = (pQVar11->mAB).d.size;
    if (lVar30 != 0) {
      pvVar31 = (pQVar11->mAB).d.ptr;
      lVar30 = lVar30 * 0x1c8;
      do {
        lVar28 = (long)(char)*(__index_type *)
                              ((long)&(pvVar31->
                                      super__Variant_base<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      ).
                                      super__Move_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Copy_assign_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Move_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Copy_ctor_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                                      .
                                      super__Variant_storage_alias<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>
                              + 0x1c0);
        local_50.buffer = &local_40;
        local_50.len = len;
        if (lVar28 == -1) {
          abort();
        }
        (*std::__detail::__variant::
          __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/gui/painting/qcolortransform.cpp:1871:20)_&&,_const_std::variant<QColorSpacePrivate::TransferElement,_QColorMatrix,_QColorVector,_QColorCLUT>_&>
          ::_S_vtable._M_arr[lVar28]._M_data)(&local_50,pvVar31);
        pvVar31 = pvVar31 + 1;
        lVar30 = lVar30 + -0x1c8;
      } while (lVar30 != 0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QColorTransformPrivate::applyConvertIn(const S *src, QColorVector *buffer, qsizetype len, TransformFlags flags) const
{
    if constexpr (IsGrayscale<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            loadGray(buffer, src, len, this);
            if (!colorSpaceOut->isThreeComponentMatrix() || colorSpaceIn->colorModel != QColorSpace::ColorModel::Gray) {
                if (!colorSpaceIn->chad.isNull())
                    applyMatrix<DoClamp>(buffer, len, colorSpaceIn->chad);
            }
            return;
        }
    } else if constexpr (CanUseThreeComponent<S>) {
        if (colorSpaceIn->isThreeComponentMatrix()) {
            if (flags & InputPremultiplied)
                loadPremultiplied(buffer, src, len, this);
            else
                loadUnpremultiplied(buffer, src, len, this);

            if (!colorSpaceOut->isThreeComponentMatrix())
                applyMatrix<DoClamp>(buffer, len, colorMatrix);
            return;
        }
    }
    Q_ASSERT(!colorSpaceIn->isThreeComponentMatrix());

    if (flags & InputPremultiplied)
        loadPremultipliedLUT(buffer, src, len);
    else
        loadUnpremultipliedLUT(buffer, src, len);

    // Do element based conversion
    for (auto &&element : colorSpaceIn->mAB)
        std::visit([&buffer, len](auto &&elm) { visitElement(elm, buffer, len); }, element);
}